

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O3

void __thiscall
Inferences::Instantiation::tryMakeLiteralFalse
          (Instantiation *this,Literal *lit,Stack<Kernel::Substitution> *subs)

{
  bool bVar1;
  Interpretation IVar2;
  Term *pTVar3;
  Substitution *pSVar4;
  ulong uVar5;
  socklen_t __len;
  undefined8 uVar6;
  Instantiation *this_00;
  Term *term;
  int __fd;
  Term *pTVar7;
  Substitution s2;
  Substitution s1;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_120;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_f8;
  VariableIterator local_d0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_88;
  undefined1 local_58 [24];
  Entry *local_40;
  Entry *local_38;
  
  bVar1 = Kernel::Theory::isInterpretedPredicate
                    ((Theory *)Kernel::theory,(lit->super_Term)._functor);
  if (((bVar1) &&
      (IVar2 = Kernel::Theory::interpretPredicate((Theory *)Kernel::theory,lit),
      IVar2 < REAL_LESS_EQUAL)) &&
     (uVar6 = 0x204041, (0x204041U >> (IVar2 & INT_REMAINDER_E) & 1) != 0)) {
    uVar5 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
    pTVar3 = (Term *)(lit->super_Term)._args[uVar5 - 1]._content;
    pTVar7 = (Term *)(lit->super_Term)._args[uVar5]._content;
    if (((ulong)pTVar7 & 1) == 0) {
      term = pTVar7;
      pTVar7 = pTVar3;
      if (((ulong)pTVar3 & 1) == 0) {
        return;
      }
    }
    else {
      term = pTVar3;
      if (((ulong)pTVar3 & 1) != 0) {
        return;
      }
    }
    if (term != (Term *)0x0) {
      Kernel::VariableIterator::VariableIterator(&local_d0,term);
      do {
        bVar1 = Kernel::VariableIterator::hasNext(&local_d0);
        __fd = (int)((ulong)pTVar7 >> 2);
        if (!bVar1) {
          local_f8._timestamp = 1;
          local_f8._size = 0;
          local_f8._deleted = 0;
          local_f8._capacityIndex = 0;
          local_f8._capacity = 0;
          local_f8._20_8_ = 0;
          local_f8._28_8_ = 0;
          local_f8._afterLast._4_4_ = 0;
          Kernel::Substitution::bind
                    ((Substitution *)&local_f8,__fd,(sockaddr *)term,(socklen_t)uVar6);
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     local_58,&local_f8);
          pSVar4 = subs->_cursor;
          if (pSVar4 == subs->_end) {
            Lib::Stack<Kernel::Substitution>::expand(subs);
            pSVar4 = subs->_cursor;
          }
          (pSVar4->_map)._timestamp = 1;
          (pSVar4->_map)._size = 0;
          (pSVar4->_map)._deleted = 0;
          (pSVar4->_map)._capacityIndex = 0;
          (pSVar4->_map)._capacity = 0;
          *(undefined8 *)&(pSVar4->_map)._nextExpansionOccupancy = 0;
          *(undefined8 *)((long)&(pSVar4->_map)._entries + 4) = 0;
          __len = 0;
          *(undefined4 *)((long)&(pSVar4->_map)._afterLast + 4) = 0;
          this_00 = (Instantiation *)local_58;
          (pSVar4->_map)._timestamp = local_58._0_4_;
          (pSVar4->_map)._size = local_58._4_4_;
          (pSVar4->_map)._deleted = local_58._8_4_;
          (pSVar4->_map)._capacityIndex = local_58._12_4_;
          local_58._0_8_ = (_func_int **)0x1;
          local_58._8_8_ = (SaturationAlgorithm *)0x0;
          (pSVar4->_map)._capacity = local_58._16_4_;
          local_58._16_4_ = 0;
          (pSVar4->_map)._nextExpansionOccupancy = local_58._20_4_;
          local_58._20_4_ = 0;
          (pSVar4->_map)._entries = local_40;
          local_40 = (Entry *)0x0;
          (pSVar4->_map)._afterLast = local_38;
          local_38 = (Entry *)0x0;
          subs->_cursor = subs->_cursor + 1;
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     this_00);
          if ((((lit->super_Term)._args[0]._content & 4) != 0) &&
             (pTVar3 = tryGetDifferentValue(this_00,term), pTVar3 != (Term *)0x0)) {
            local_120._timestamp = 1;
            local_120._size = 0;
            local_120._deleted = 0;
            local_120._capacityIndex = 0;
            local_120._capacity = 0;
            local_120._20_8_ = 0;
            local_120._28_8_ = 0;
            local_120._afterLast._4_4_ = 0;
            Kernel::Substitution::bind((Substitution *)&local_120,__fd,(sockaddr *)pTVar3,__len);
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                      (&local_88,&local_120);
            pSVar4 = subs->_cursor;
            if (pSVar4 == subs->_end) {
              Lib::Stack<Kernel::Substitution>::expand(subs);
              pSVar4 = subs->_cursor;
            }
            (pSVar4->_map)._timestamp = 1;
            (pSVar4->_map)._size = 0;
            (pSVar4->_map)._deleted = 0;
            (pSVar4->_map)._capacityIndex = 0;
            (pSVar4->_map)._capacity = 0;
            *(undefined8 *)&(pSVar4->_map)._nextExpansionOccupancy = 0;
            *(undefined8 *)((long)&(pSVar4->_map)._entries + 4) = 0;
            *(undefined4 *)((long)&(pSVar4->_map)._afterLast + 4) = 0;
            (pSVar4->_map)._timestamp = local_88._timestamp;
            (pSVar4->_map)._size = local_88._size;
            (pSVar4->_map)._deleted = local_88._deleted;
            (pSVar4->_map)._capacityIndex = local_88._capacityIndex;
            local_88._timestamp = 1;
            local_88._size = 0;
            local_88._deleted = 0;
            local_88._capacityIndex = 0;
            (pSVar4->_map)._capacity = local_88._capacity;
            local_88._capacity = 0;
            (pSVar4->_map)._nextExpansionOccupancy = local_88._nextExpansionOccupancy;
            local_88._nextExpansionOccupancy = 0;
            (pSVar4->_map)._entries = local_88._entries;
            local_88._entries = (Entry *)0x0;
            (pSVar4->_map)._afterLast = local_88._afterLast;
            local_88._afterLast = (Entry *)0x0;
            subs->_cursor = subs->_cursor + 1;
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                      (&local_88);
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                      (&local_120);
          }
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    (&local_f8);
          break;
        }
        local_d0._used = true;
      } while ((int)(local_d0._stack._cursor[-1]->_content >> 2) != __fd);
      local_d0.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
           (_func_int **)&PTR__VariableIterator_00b3d820;
      if (local_d0._stack._stack != (TermList **)0x0) {
        uVar5 = local_d0._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar5 == 0) {
          *local_d0._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_d0._stack._stack;
        }
        else if (uVar5 < 0x11) {
          *local_d0._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_d0._stack._stack;
        }
        else if (uVar5 < 0x19) {
          *local_d0._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_d0._stack._stack;
        }
        else if (uVar5 < 0x21) {
          *local_d0._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_d0._stack._stack;
        }
        else if (uVar5 < 0x31) {
          *local_d0._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_d0._stack._stack;
        }
        else if (uVar5 < 0x41) {
          *local_d0._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_d0._stack._stack;
        }
        else {
          operator_delete(local_d0._stack._stack,0x10);
        }
      }
    }
  }
  return;
}

Assistant:

void Instantiation::tryMakeLiteralFalse(Literal* lit, Stack<Substitution>& subs)
{
  if(theory->isInterpretedPredicate(lit->functor())){
    Interpretation itp = theory->interpretPredicate(lit);
    //unsigned sort = theory->getOperationSort(interpretation);

    //TODO, very limited consideration, expand
    if (itp == Theory::EQUAL || itp == Theory::INT_LESS || itp == Theory::RAT_LESS || itp == Theory::REAL_LESS) {
      TermList* left = lit->nthArgument(0); TermList* right = lit->nthArgument(1);
      unsigned var;
      Term* t = 0;
      if(left->isVar() && !right->isVar()){
       t = right->term();
       var = left->var();
      }
      if(right->isVar() && !left->isVar()){
       t = left->term();
       var = right->var();
      }
      if(t){
        // do occurs check
        VariableIterator vit(t);
        while(vit.hasNext()) if(vit.next().var()==var) return;

        // we are okay
        Substitution s1;
        s1.bind(var,t);
        subs.push(s1);
        if(lit->polarity()){
         t = tryGetDifferentValue(t);
         if(t){
           Substitution s2;
           s2.bind(var,t);
           subs.push(s2);
         }
        }
      }
    }
    // TODO cover other cases ...
  }
}